

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
astar::astar_path(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  *__return_storage_ptr__,astar *this,
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *map)

{
  allocator<std::vector<int,_std::allocator<int>_>_> *paVar1;
  allocator<int> *paVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  ostream *this_00;
  int local_248 [2];
  pair<int,_int> local_240;
  undefined1 local_238 [8];
  nodes child;
  int dy;
  int dx;
  int dir;
  value_type local_204;
  int local_200;
  int j;
  int q;
  int p;
  nodes current;
  undefined1 local_1d8 [8];
  nodes start;
  int local_1b8 [8];
  iterator local_198;
  size_type local_190;
  undefined1 local_188 [8];
  vector<int,_std::allocator<int>_> moveY;
  int local_168 [8];
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  vector<int,_std::allocator<int>_> moveX;
  vector<int,_std::allocator<int>_> local_118;
  undefined1 local_100 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  parentDir;
  vector<int,_std::allocator<int>_> local_e0;
  undefined1 local_c8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  visited;
  vector<int,_std::allocator<int>_> local_a8;
  undefined1 local_90 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  open;
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> temp_list;
  undefined1 local_48 [8];
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> open_list;
  int neighbours;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *map_local;
  astar *this_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *path;
  
  open_list._28_4_ = 8;
  open_list._27_1_ = 0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__);
  std::priority_queue<nodes,std::vector<nodes,std::allocator<nodes>>,std::greater<nodes>>::
  priority_queue<std::vector<nodes,std::allocator<nodes>>,void>
            ((priority_queue<nodes,std::vector<nodes,std::allocator<nodes>>,std::greater<nodes>> *)
             local_48);
  std::priority_queue<nodes,std::vector<nodes,std::allocator<nodes>>,std::greater<nodes>>::
  priority_queue<std::vector<nodes,std::allocator<nodes>>,void>
            ((priority_queue<nodes,std::vector<nodes,std::allocator<nodes>>,std::greater<nodes>> *)
             &open.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  visited.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  paVar2 = (allocator<int> *)
           ((long)&visited.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar2);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,800,
             (value_type *)
             ((long)&visited.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar2);
  paVar1 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&visited.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_90,800,&local_a8,paVar1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&visited.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::vector<int,_std::allocator<int>_>::~vector(&local_a8);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&visited.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  parentDir.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  paVar2 = (allocator<int> *)
           ((long)&parentDir.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar2);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,800,
             (value_type *)
             ((long)&parentDir.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar2);
  paVar1 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&parentDir.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c8,800,&local_e0,paVar1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&parentDir.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::vector<int,_std::allocator<int>_>::~vector(&local_e0);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&parentDir.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar2 = (allocator<int> *)
           ((long)&moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar2);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_118,800,
             (value_type *)
             ((long)&moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar2);
  paVar1 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_100,800,&local_118,paVar1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2));
  std::vector<int,_std::allocator<int>_>::~vector(&local_118);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  local_168[4] = -1;
  local_168[5] = -1;
  local_168[6] = 0;
  local_168[7] = 1;
  local_168[0] = 1;
  local_168[1] = 1;
  local_168[2] = 0;
  local_168[3] = -1;
  local_148 = local_168;
  local_140 = 8;
  paVar2 = (allocator<int> *)
           ((long)&moveY.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  __l_00._M_len = local_140;
  __l_00._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_138,__l_00,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&moveY.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_1b8[4] = 0;
  local_1b8[5] = -1;
  local_1b8[6] = -1;
  local_1b8[7] = -1;
  local_1b8[0] = 0;
  local_1b8[1] = 1;
  local_1b8[2] = 1;
  local_1b8[3] = 1;
  local_198 = local_1b8;
  local_190 = 8;
  paVar2 = (allocator<int> *)((long)&start.f_cost_ + 7);
  std::allocator<int>::allocator(paVar2);
  __l._M_len = local_190;
  __l._M_array = local_198;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_188,__l,paVar2);
  std::allocator<int>::~allocator((allocator<int> *)((long)&start.f_cost_ + 7));
  nodes::nodes((nodes *)local_1d8,this->x_start_,this->y_start_,0.0,0.0);
  start.g_cost_ = nodes::compute_f((nodes *)local_1d8,this->x_goal_,this->y_goal_);
  std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::push
            ((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
              *)local_48,(value_type *)local_1d8);
  iVar4 = (int)start.g_cost_;
  pvVar6 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)local_90,(long)(int)local_1d8._0_4_);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)(int)local_1d8._4_4_);
  *pvVar7 = iVar4;
  do {
    bVar3 = std::
            priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
            ::empty((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                     *)local_48);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,"Path not found.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_248[1] = 0xffffffff;
      local_248[0] = -1;
      local_240 = std::make_pair<int,int>(local_248 + 1,local_248);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (__return_storage_ptr__,&local_240);
      open_list._27_1_ = 1;
      break;
    }
    pvVar8 = std::
             priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
             ::top((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                    *)local_48);
    current.g_cost_ = pvVar8->f_cost_;
    q = pvVar8->x_;
    p = pvVar8->y_;
    current._0_8_ = pvVar8->g_cost_;
    std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::
    pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> *)
        local_48);
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_90,(long)q);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)p);
    *pvVar7 = 0;
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_c8,(long)q);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)p);
    *pvVar7 = 1;
    if ((q == this->x_goal_) && (p == this->y_goal_)) {
      j = q;
      local_200 = p;
      while( true ) {
        bVar3 = false;
        if (j == this->x_start_) {
          bVar3 = local_200 == this->y_start_;
        }
        if (bVar3) break;
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_100,(long)j);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_200);
        local_204 = *pvVar7;
        _dir = std::make_pair<int&,int&>(&j,&local_200);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (__return_storage_ptr__,(value_type *)&dir);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_138,(long)local_204);
        j = *pvVar7 + j;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_188,(long)local_204);
        local_200 = *pvVar7 + local_200;
      }
      open_list._27_1_ = 1;
      bVar3 = true;
    }
    else {
      for (dy = 0; dy < 8; dy = dy + 1) {
        iVar4 = q;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_138,(long)dy);
        iVar4 = iVar4 + *pvVar7;
        iVar5 = p;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_188,(long)dy);
        child.f_cost_._4_4_ = iVar5 + *pvVar7;
        if ((((-1 < iVar4) && (iVar4 < 800)) && (-1 < child.f_cost_._4_4_)) &&
           (child.f_cost_._4_4_ < 800)) {
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](map,(long)iVar4);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (pvVar6,(long)child.f_cost_._4_4_);
          if (*pvVar7 != 0) {
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_c8,(long)iVar4);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar6,(long)child.f_cost_._4_4_);
            if (*pvVar7 != 1) {
              nodes::nodes((nodes *)local_238,iVar4,child.f_cost_._4_4_,(double)current._0_8_,
                           current.g_cost_);
              child._0_8_ = nodes::compute_g((nodes *)local_238,dy);
              child.g_cost_ = nodes::compute_f((nodes *)local_238,this->x_goal_,this->y_goal_);
              pvVar6 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_90,(long)iVar4);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pvVar6,(long)child.f_cost_._4_4_);
              if (*pvVar7 == 0) {
                iVar5 = (int)child.g_cost_;
                pvVar6 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       *)local_90,(long)iVar4);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar6,(long)child.f_cost_._4_4_);
                *pvVar7 = iVar5;
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)local_48,(value_type *)local_238);
                iVar5 = (dy + (int)open_list._28_4_ / 2) % (int)open_list._28_4_;
                pvVar6 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       *)local_100,(long)iVar4);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar6,(long)child.f_cost_._4_4_);
                *pvVar7 = iVar5;
              }
              else {
                pvVar6 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       *)local_90,(long)iVar4);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pvVar6,(long)child.f_cost_._4_4_);
                if (child.g_cost_ < (double)*pvVar7) {
                  iVar5 = (int)child.g_cost_;
                  pvVar6 = std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)local_90,(long)iVar4);
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (pvVar6,(long)child.f_cost_._4_4_);
                  *pvVar7 = iVar5;
                  pvVar6 = std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)local_100,(long)iVar4);
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (pvVar6,(long)child.f_cost_._4_4_);
                  *pvVar7 = (dy + 4) % 8;
                  while( true ) {
                    pvVar8 = std::
                             priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                             ::top((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                                    *)local_48);
                    bVar3 = false;
                    if (pvVar8->x_ == iVar4) {
                      pvVar8 = std::
                               priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                               ::top((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                                      *)local_48);
                      bVar3 = pvVar8->y_ == child.f_cost_._4_4_;
                    }
                    if (bVar3) break;
                    pvVar8 = std::
                             priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                             ::top((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                                    *)local_48);
                    std::
                    priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                    ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                            *)&open.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
                    std::
                    priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                    ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                           *)local_48);
                  }
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)local_48);
                  while (bVar3 = std::
                                 priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                                 ::empty((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                                          *)&open.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
                        ((bVar3 ^ 0xffU) & 1) != 0) {
                    pvVar8 = std::
                             priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                             ::top((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                                    *)&open.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                    ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                            *)local_48,pvVar8);
                    std::
                    priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                    ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                           *)&open.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)local_48,(value_type *)local_238);
                }
              }
              nodes::~nodes((nodes *)local_238);
            }
          }
        }
      }
      bVar3 = false;
    }
    nodes::~nodes((nodes *)&q);
  } while (!bVar3);
  nodes::~nodes((nodes *)local_1d8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_188);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_138);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_100);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_90);
  std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::
  ~priority_queue((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                   *)&open.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::
  ~priority_queue((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                   *)local_48);
  if ((open_list._27_1_ & 1) == 0) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, int>> astar::astar_path(
                                std::vector<std::vector<int>> map) {
    int neighbours = 8;  // max no of possible neighbors for any node

    std::vector<std::pair<int, int>> path;
    // Create a priority list of open nodes
    std::priority_queue<nodes, std::vector<nodes>,
                        std::greater<nodes>> open_list;
    // Create a priority list to store temporary nodes
    std::priority_queue<nodes, std::vector<nodes>,
                          std::greater<nodes>> temp_list;
    // Create 2D vectors to store open and visited nodes.
    std::vector<std::vector<int> > open(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > visited(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > parentDir(800, std::vector<int>(800, 0));

    // 8 possible moves in x and y direction
    std::vector<int> moveX { 1, 1, 0, -1, -1, -1, 0, 1 };
    std::vector<int> moveY { 0, 1, 1, 1, 0, -1, -1, -1 };

    nodes start(x_start_, y_start_, 0, 0);
    start.f_cost_ = start.compute_f(x_goal_, y_goal_);
    open_list.push(start);
    open[start.x_][start.y_] = start.f_cost_;

    /**This loop takes the first entry of the open list as the current node
     * since it has the lowest total cost function.*/

    while (!open_list.empty()) {
      nodes current = open_list.top();
      open_list.pop();
      open[current.x_][current.y_] = 0;
      visited[current.x_][current.y_] = 1;

      /** Trace the path and store it of the goal is found.*/

      if (current.x_ == x_goal_ && current.y_ == y_goal_) {
        int p = current.x_, q = current.y_;
        while (!(p == x_start_ && q == y_start_)) {
          int j = parentDir[p][q];
          path.push_back(std::make_pair(p, q));
          p += moveX[j];
          q += moveY[j];
        }
        return path;
      }

      /** Expand all the nodes for current node, calculate their 
       * costs and store them in their variables.*/
      int dir = 0;
      while (dir < 8) {
          int dx = current.x_ + moveX[dir], dy = current.y_ + moveY[dir];
          /** For all the nodes lying outside the map, blocked
           * or is in the visisted list then simply ignor them.*/
        if (!(dx < 0 || dx > 799 || dy < 0 || dy > 799 ||
              map[dx][dy] == 0 || visited[dx][dy] == 1)) {
            nodes child(dx, dy, current.g_cost_, current.f_cost_);
            child.g_cost_ = child.compute_g(dir);
            child.f_cost_ = child.compute_f(x_goal_, y_goal_);
            /* For new nodes, calculate their costs and store them.*/
          if (open[dx][dy] == 0) {
              open[dx][dy] = child.f_cost_;
              open_list.push(child);
              parentDir[dx][dy] = (dir + neighbours / 2) % neighbours;
            /* If the node exists in open list but has more
            * promising total cost then it is replaced by
            * the previous node and it's parent direction is updated.*/
            } else if (open[dx][dy] > child.f_cost_) {
              open[dx][dy] = child.f_cost_;
              parentDir[dx][dy] = (dir + 8 / 2) % 8;
            while (!(open_list.top().x_ == dx && open_list.top().y_ == dy)) {
              temp_list.push(open_list.top());
              open_list.pop();
            }
            open_list.pop();
            while (!temp_list.empty()) {
              open_list.push(temp_list.top());
              temp_list.pop();
            }
            open_list.push(child);
          }
        }
        ++dir;
      }
    }
    std::cout << "Path not found."
              << std::endl;
    path.push_back(std::make_pair(-1, -1));
    return path;
}